

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptConversion.cpp
# Opt level: O2

BOOL Js::JavascriptConversion::ToInt32Finite(Var aValue,ScriptContext *scriptContext,int32 *result)

{
  Type TVar1;
  code *pcVar2;
  double value;
  bool bVar3;
  bool bVar4;
  BOOL BVar5;
  int32 iVar6;
  RecyclableObject *pRVar7;
  undefined4 *puVar8;
  JavascriptBoolean *pJVar9;
  JavascriptString *this;
  JavascriptTypedNumber<long> *pJVar10;
  JavascriptTypedNumber<unsigned_long> *pJVar11;
  ScriptContext *local_48;
  
  bVar3 = VarIs<Js::RecyclableObject>(aValue);
  if (bVar3) {
    pRVar7 = UnsafeVarTo<Js::RecyclableObject>(aValue);
    local_48 = (((((pRVar7->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
               scriptContext.ptr;
  }
  else {
    local_48 = (ScriptContext *)0x0;
  }
  bVar3 = true;
  puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
LAB_00985828:
  if (aValue == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar4) goto LAB_00985acd;
    *puVar8 = 0;
  }
  bVar4 = TaggedInt::Is(aValue);
  if (bVar4) {
switchD_009859b9_caseD_3:
    iVar6 = TaggedInt::ToInt32(aValue);
    *result = iVar6;
    return 1;
  }
  if ((ulong)aValue >> 0x32 != 0) {
switchD_009859b9_caseD_4:
    value = JavascriptNumber::GetValue(aValue);
    goto LAB_00985a3c;
  }
  pRVar7 = UnsafeVarTo<Js::RecyclableObject>(aValue);
  if (pRVar7 == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
    if (!bVar4) goto LAB_00985acd;
    *puVar8 = 0;
  }
  TVar1 = ((pRVar7->type).ptr)->typeId;
  if ((0x57 < (int)TVar1) && (BVar5 = RecyclableObject::IsExternal(pRVar7), BVar5 == 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                "GetTypeId aValue has invalid TypeId");
    if (!bVar4) goto LAB_00985acd;
    *puVar8 = 0;
  }
  switch(TVar1) {
  case TypeIds_Null:
    *result = 0;
    return 1;
  case TypeIds_Boolean:
    pJVar9 = UnsafeVarTo<Js::JavascriptBoolean>(aValue);
    *result = (uint)(pJVar9->value != 0);
    return 1;
  case TypeIds_FirstNumberType:
    goto switchD_009859b9_caseD_3;
  case TypeIds_Number:
    goto switchD_009859b9_caseD_4;
  case TypeIds_Int64Number:
    pJVar10 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aValue);
    value = (double)pJVar10->m_value;
    break;
  case TypeIds_LastNumberType:
    pJVar11 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aValue);
    value = ((double)CONCAT44(0x43300000,(int)pJVar11->m_value) - 4503599627370496.0) +
            ((double)CONCAT44(0x45300000,(int)(pJVar11->m_value >> 0x20)) - 1.9342813113834067e+25);
    break;
  case TypeIds_String:
    this = UnsafeVarTo<Js::JavascriptString>(aValue);
    value = JavascriptString::ToDouble(this);
    break;
  case TypeIds_Symbol:
    JavascriptError::TryThrowTypeError(local_48,scriptContext,-0x7ff5ec77,(PCWSTR)0x0);
  case TypeIds_Undefined:
    *result = 0;
    return 0;
  default:
    BVar5 = JavascriptOperators::IsObject(aValue);
    if (BVar5 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptConversion.cpp"
                                  ,0x45d,"(JavascriptOperators::IsObject(aValue))",
                                  "bad type object in conversion ToInteger32");
      if (!bVar4) goto LAB_00985acd;
      *puVar8 = 0;
    }
    if (bVar3) goto code_r0x00985991;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptConversion.cpp"
                                ,0x460,"(0)",
                                "wrong call in ToInteger32_Full, no dynamic objects should get here"
                               );
    if (bVar3) {
      *puVar8 = 0;
      JavascriptError::ThrowError(scriptContext,-0x7ff5fe4a,(PCWSTR)0x0);
    }
LAB_00985acd:
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
LAB_00985a3c:
  BVar5 = ToInt32Finite(value,result);
  return BVar5;
code_r0x00985991:
  aValue = ToPrimitive<(Js::JavascriptHint)2>(aValue,scriptContext);
  bVar3 = false;
  goto LAB_00985828;
}

Assistant:

BOOL JavascriptConversion::ToInt32Finite(Var aValue, ScriptContext* scriptContext, int32* result)
    {
        ScriptContext * objectScriptContext = VarIs<RecyclableObject>(aValue) ? UnsafeVarTo<RecyclableObject>(aValue)->GetScriptContext() : nullptr;
        BOOL fPrimitiveOnly = false;
        while(true)
        {
            switch (JavascriptOperators::GetTypeId(aValue))
            {
            case TypeIds_Symbol:
                JavascriptError::TryThrowTypeError(objectScriptContext, scriptContext, JSERR_NeedNumber);
                // Fallthrough to return false and set result to 0 if exceptions are disabled
            case TypeIds_Undefined:
                *result = 0;
                return false;

            case TypeIds_Null:
                *result = 0;
                return true;

            case TypeIds_Integer:
                *result = TaggedInt::ToInt32(aValue);
                return true;

            case TypeIds_Boolean:
                *result = UnsafeVarTo<JavascriptBoolean>(aValue)->GetValue() ? 1 : +0;
                return true;

            case TypeIds_Number:
                return ToInt32Finite(JavascriptNumber::GetValue(aValue), result);

            case TypeIds_Int64Number:
                // we won't lose precision if the int64 is within 32bit boundary; otherwise we need to
                // treat it as double anyhow.
                return ToInt32Finite((double)UnsafeVarTo<JavascriptInt64Number>(aValue)->GetValue(), result);

            case TypeIds_UInt64Number:
                // we won't lose precision if the int64 is within 32bit boundary; otherwise we need to
                // treat it as double anyhow.
                return ToInt32Finite((double)UnsafeVarTo<JavascriptUInt64Number>(aValue)->GetValue(), result);

            case TypeIds_String:
                return ToInt32Finite(UnsafeVarTo<JavascriptString>(aValue)->ToDouble(), result);

            default:
                {
                    AssertMsg(JavascriptOperators::IsObject(aValue), "bad type object in conversion ToInteger32");
                    if(fPrimitiveOnly)
                    {
                        AssertMsg(FALSE, "wrong call in ToInteger32_Full, no dynamic objects should get here");
                        JavascriptError::ThrowError(scriptContext, VBSERR_OLENoPropOrMethod);
                    }
                    fPrimitiveOnly = true;
                    aValue = ToPrimitive<JavascriptHint::HintNumber>(aValue, scriptContext);
                }
            }
        }
    }